

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int main(int argc,char **argv)

{
  StkId pTVar1;
  int iVar2;
  int iVar3;
  lua_State *plVar4;
  int nrec;
  luaL_Reg *lib;
  luaL_Reg *plVar5;
  ulong uVar6;
  code *fn;
  StkId local_40;
  undefined4 local_38;
  
  plVar4 = (lua_State *)malloc(0x268);
  if (plVar4 != (lua_State *)0x0) {
    plVar4->next = (GCObject *)0x0;
    plVar4->tt = '\b';
    *(undefined1 *)&plVar4[1].l_G = 0x21;
    plVar4->marked = 'a';
    plVar4->status = '\0';
    plVar4->l_G = (global_State *)(plVar4 + 1);
    plVar4->stack = (StkId)0x0;
    plVar4->stacksize = 0;
    plVar4->errorJmp = (lua_longjmp *)0x0;
    plVar4->errfunc = 0;
    plVar4->hookmask = '\0';
    plVar4->allowhook = '\x01';
    plVar4->basehookcount = 0;
    plVar4->hookcount = 0;
    plVar4->hook = (lua_Hook)0x0;
    plVar4->openupval = (GCObject *)0x0;
    plVar4->base_ci = (CallInfo *)0x0;
    (plVar4->l_gt).tt = 0;
    plVar4->ci = (CallInfo *)0x0;
    plVar4->savedpc = (Instruction *)0x0;
    plVar4->size_ci = 0;
    plVar4->nCcalls = 0;
    plVar4->baseCcalls = 0;
    plVar4[1].top = (StkId)l_alloc;
    plVar4[1].base = (StkId)0x0;
    plVar4[1].errfunc = (ptrdiff_t)plVar4;
    plVar4[2].base = (StkId)(plVar4 + 2);
    plVar4[2].l_G = (global_State *)(plVar4 + 2);
    *(undefined4 *)&plVar4[1].errorJmp = 0;
    plVar4[1].stacksize = 0;
    plVar4[1].size_ci = 0;
    plVar4[1].openupval = (GCObject *)0x0;
    *(undefined1 *)((long)&plVar4[1].l_G + 1) = 0;
    plVar4[1].next = (GCObject *)0x0;
    plVar4[1].tt = '\0';
    plVar4[1].marked = '\0';
    plVar4[1].status = '\0';
    *(undefined5 *)&plVar4[1].field_0xb = 0;
    plVar4[1].basehookcount = 0;
    plVar4[1].hookcount = 0;
    plVar4[1].hook = (lua_Hook)0x0;
    plVar4[1].ci = (CallInfo *)plVar4;
    *(undefined4 *)((long)&plVar4[1].l_G + 4) = 0;
    plVar4[1].savedpc = (Instruction *)&plVar4[1].ci;
    plVar4[1].stack_last = (StkId)0x0;
    plVar4[1].stack = (StkId)0x0;
    plVar4[1].end_ci = (CallInfo *)0x0;
    plVar4[1].base_ci = (CallInfo *)0x0;
    plVar4[1].l_gt.value.n = 3.04344437838208e-321;
    *(undefined8 *)&plVar4[1].env.tt = 0xc8000000c8;
    plVar4[1].env.value.gc = (GCObject *)0x0;
    plVar4[2].ci = (CallInfo *)0x0;
    plVar4[2].savedpc = (Instruction *)0x0;
    plVar4[2].stack_last = (StkId)0x0;
    plVar4[2].stack = (StkId)0x0;
    plVar4[2].end_ci = (CallInfo *)0x0;
    plVar4[2].base_ci = (CallInfo *)0x0;
    plVar4[2].stacksize = 0;
    plVar4[2].size_ci = 0;
    plVar4[2].nCcalls = 0;
    plVar4[2].baseCcalls = 0;
    plVar4[2].hookmask = '\0';
    plVar4[2].allowhook = '\0';
    *(undefined2 *)&plVar4[2].field_0x66 = 0;
    plVar4[2].basehookcount = 0;
    plVar4[2].hookcount = 0;
    iVar2 = luaD_rawrunprotected(plVar4,f_luaopen,(void *)0x0);
    if (iVar2 == 0) goto LAB_001035c5;
    close_state(plVar4);
  }
  plVar4 = (lua_State *)0x0;
LAB_001035c5:
  if (plVar4 != (lua_State *)0x0) {
    plVar4->l_G->panic = panic;
  }
  plVar5 = lualibs;
  fn = luaopen_base;
  do {
    lua_pushcclosure(plVar4,fn,0);
    fn = plVar5[1].func;
    lua_pushstring(plVar4,plVar5->name);
    luaD_call(plVar4,plVar4->top + -2,0);
    plVar5 = plVar5 + 1;
  } while (fn != (lua_CFunction)0x0);
  luaL_register(plVar4,"bit",bitlib);
  iVar2 = 8;
  if (1 < argc) {
    iVar2 = 1;
    lua_createtable(plVar4,1,nrec);
    lua_pushstring(plVar4,argv[1]);
    lua_rawseti(plVar4,-2,0);
    lua_setfield(plVar4,-0x2712,"arg");
    iVar3 = luaL_loadfile(plVar4,argv[1]);
    if (iVar3 == 0) {
      if (argc != 2) {
        uVar6 = 2;
        do {
          lua_pushstring(plVar4,argv[uVar6]);
          uVar6 = uVar6 + 1;
        } while ((uint)argc != uVar6);
      }
      local_40 = plVar4->top + (1 - argc);
      local_38 = 0;
      iVar3 = luaD_pcall(plVar4,f_call,&local_40,(long)local_40 - (long)plVar4->stack,0);
      if (iVar3 == 0) {
        plVar4 = plVar4->l_G->mainthread;
        luaF_close(plVar4,plVar4->stack);
        luaC_separateudata(plVar4,1);
        plVar4->errfunc = 0;
        do {
          plVar4->ci = plVar4->base_ci;
          pTVar1 = plVar4->base_ci->base;
          plVar4->top = pTVar1;
          plVar4->base = pTVar1;
          plVar4->nCcalls = 0;
          plVar4->baseCcalls = 0;
          iVar2 = luaD_rawrunprotected(plVar4,callallgcTM,(void *)0x0);
        } while (iVar2 != 0);
        close_state(plVar4);
        return 0;
      }
    }
    main_cold_1();
  }
  return iVar2;
}

Assistant:

int main(int argc,char**argv){
lua_State*L=luaL_newstate();
int i;
luaL_openlibs(L);
luaL_register(L,"bit",bitlib);
if(argc<2)return sizeof(void*);
lua_createtable(L,0,1);
lua_pushstring(L,argv[1]);
lua_rawseti(L,-2,0);
lua_setglobal(L,"arg");
if(luaL_loadfile(L,argv[1]))
goto err;
for(i=2;i<argc;i++)
lua_pushstring(L,argv[i]);
if(lua_pcall(L,argc-2,0,0)){
err:
fprintf(stderr,"Error: %s\n",lua_tostring(L,-1));
return 1;
}
lua_close(L);
return 0;
}